

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sq.c
# Opt level: O3

void Interactive(HSQUIRRELVM v)

{
  bool bVar1;
  int iVar2;
  SQChar *pSVar3;
  SQChar *__s;
  size_t sVar4;
  SQRESULT SVar5;
  ulong uVar6;
  long lVar7;
  SQBool retval;
  SQInteger done;
  SQChar buffer [1024];
  long local_448;
  undefined8 local_440;
  char local_438 [1032];
  
  local_448 = 0;
  fprintf(_stdout,"%s %s (%d bits)\n","Squirrel 3.1 stable",
          "Copyright (C) 2003-2016 Alberto Demichelis",0x40);
  sq_pushroottable(v);
  sq_pushstring(v,"quit",-1);
  sq_pushuserpointer(v,&local_448);
  sq_newclosure(v,quit,1);
  sq_setparamscheck(v,1,(SQChar *)0x0);
  sq_newslot(v,-3,0);
  sq_pop(v,1);
  if (local_448 != 0) {
    return;
  }
  lVar7 = 0;
  bVar1 = false;
  retval = 0;
LAB_00110b02:
  printf("\nsq>");
  if (local_448 != 0) {
    return;
  }
  uVar6 = 0;
  do {
    iVar2 = getchar();
    if (iVar2 == 0) {
LAB_00110b2d:
      if ((uVar6 == 0) || (local_438[uVar6 - 1] != '\\')) {
        iVar2 = 10;
        if (lVar7 == 0) break;
      }
      else {
        local_438[uVar6 - 1] = '\n';
        iVar2 = 10;
      }
    }
    else if (iVar2 == 0x7d) {
      lVar7 = lVar7 + -1;
      iVar2 = 0x7d;
    }
    else {
      if (iVar2 == 10) goto LAB_00110b2d;
      if ((iVar2 != 0x7b) || (bVar1)) {
        if ((iVar2 == 0x27) || (iVar2 == 0x22)) {
          bVar1 = !bVar1;
        }
        else if (0x3fe < uVar6) {
          Interactive_cold_1();
          goto LAB_00110ba7;
        }
      }
      else {
        lVar7 = lVar7 + 1;
        iVar2 = 0x7b;
        bVar1 = false;
      }
    }
    local_438[uVar6] = (char)iVar2;
    uVar6 = uVar6 + 1;
    if (local_448 != 0) {
      return;
    }
  } while( true );
  lVar7 = 0;
LAB_00110ba7:
  local_438[uVar6] = '\0';
  if (local_438[0] == '=') {
    pSVar3 = sq_getscratchpad(v,0x400);
    snprintf(pSVar3,0x400,"return (%s)",local_438 + 1);
    pSVar3 = sq_getscratchpad(v,-1);
    __s = sq_getscratchpad(v,-1);
    sVar4 = strlen(__s);
    memcpy(local_438,pSVar3,sVar4 + 1);
    retval = 1;
  }
  sVar4 = strlen(local_438);
  if (0 < (long)sVar4) {
    local_440 = sq_gettop(v);
    SVar5 = sq_compilebuffer(v,local_438,sVar4,"interactive console",1);
    if (-1 < SVar5) {
      sq_pushroottable(v);
      SVar5 = sq_call(v,1,retval,1);
      if (retval != 0 && -1 < SVar5) {
        putchar(10);
        sq_pushroottable(v);
        sq_pushstring(v,"print",-1);
        sq_get(v,-2);
        sq_pushroottable(v);
        sq_push(v,-4);
        sq_call(v,2,0,1);
        putchar(10);
        retval = 0;
      }
    }
    sq_settop(v,local_440);
  }
  if (local_448 != 0) {
    return;
  }
  goto LAB_00110b02;
}

Assistant:

void Interactive(HSQUIRRELVM v)
{

#define MAXINPUT 1024
    SQChar buffer[MAXINPUT];
    SQInteger blocks =0;
    SQInteger string=0;
    SQInteger retval=0;
    SQInteger done=0;
    PrintVersionInfos();

    sq_pushroottable(v);
    sq_pushstring(v,_SC("quit"),-1);
    sq_pushuserpointer(v,&done);
    sq_newclosure(v,quit,1);
    sq_setparamscheck(v,1,NULL);
    sq_newslot(v,-3,SQFalse);
    sq_pop(v,1);

    while (!done)
    {
        SQInteger i = 0;
        scprintf(_SC("\nsq>"));
        for(;;) {
            int c;
            if(done)return;
#ifdef _TINSPIRE
            c = nio_getchar();
#else
            c = getchar();
#endif
            if (c == _SC('\n') || c == 0/*nspireio*/) {
                if (i>0 && buffer[i-1] == _SC('\\'))
                {
                    buffer[i-1] = _SC('\n');
                }
                else if(blocks==0)break;
                buffer[i++] = _SC('\n');
            }
            else if (c==_SC('}')) {blocks--; buffer[i++] = (SQChar)c;}
            else if(c==_SC('{') && !string){
                    blocks++;
                    buffer[i++] = (SQChar)c;
            }
            else if(c==_SC('"') || c==_SC('\'')){
                    string=!string;
                    buffer[i++] = (SQChar)c;
            }
            else if (i >= MAXINPUT-1) {
#ifdef _TINSPIRE
                scprintf(_SC("sq : input line too long\n"));
#else
                scfprintf(stderr, _SC("sq : input line too long\n"));
#endif
                break;
            }
            else{
                buffer[i++] = (SQChar)c;
            }
        }
        buffer[i] = _SC('\0');

        if(buffer[0]==_SC('=')){
            scsprintf(sq_getscratchpad(v,MAXINPUT),(size_t)MAXINPUT,_SC("return (%s)"),&buffer[1]);
            memcpy(buffer,sq_getscratchpad(v,-1),(scstrlen(sq_getscratchpad(v,-1))+1)*sizeof(SQChar));
            retval=1;
        }
        i=scstrlen(buffer);
        if(i>0){
            SQInteger oldtop=sq_gettop(v);
            if(SQ_SUCCEEDED(sq_compilebuffer(v,buffer,i,_SC("interactive console"),SQTrue))){
                sq_pushroottable(v);
                if(SQ_SUCCEEDED(sq_call(v,1,retval,SQTrue)) &&  retval){
                    scprintf(_SC("\n"));
                    sq_pushroottable(v);
                    sq_pushstring(v,_SC("print"),-1);
                    sq_get(v,-2);
                    sq_pushroottable(v);
                    sq_push(v,-4);
                    sq_call(v,2,SQFalse,SQTrue);
                    retval=0;
                    scprintf(_SC("\n"));
                }
            }

            sq_settop(v,oldtop);
        }
    }
}